

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# newtonmin.c
# Opt level: O1

int lnsrchmod(custom_function *funcpt,custom_gradient *funcgrad,double *xi,double *jac,double *p,
             int N,double *dx,double maxstep,double eps2,double stol,double *x,double *jacf)

{
  bool bVar1;
  int iVar2;
  double *C;
  double *C_00;
  double *A;
  double *B;
  double *C_01;
  double *array;
  double *B_00;
  ulong uVar3;
  double *pdVar4;
  char *pcVar5;
  ulong uVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double local_128;
  double local_d8;
  double local_88;
  int local_54;
  
  C = (double *)malloc(8);
  C_00 = (double *)malloc(8);
  A = (double *)malloc(0x20);
  B = (double *)malloc(0x10);
  C_01 = (double *)malloc(0x10);
  array = (double *)malloc((long)N * 8);
  B_00 = (double *)malloc((long)N * 8);
  uVar6 = (ulong)(uint)N;
  dVar7 = 0.0;
  if (0 < N) {
    uVar3 = 0;
    do {
      dVar7 = dVar7 + dx[uVar3] * p[uVar3] * dx[uVar3] * p[uVar3];
      uVar3 = uVar3 + 1;
    } while (uVar6 != uVar3);
  }
  if (dVar7 < 0.0) {
    dVar7 = sqrt(dVar7);
  }
  else {
    dVar7 = SQRT(dVar7);
  }
  if (maxstep < dVar7) {
    scale(p,1,N,maxstep / dVar7);
    dVar7 = maxstep;
  }
  mmult(jac,p,C,1,N,1);
  if (0 < N) {
    uVar3 = 0;
    do {
      dVar9 = ABS(xi[uVar3]);
      if (ABS(xi[uVar3]) <= 1.0 / ABS(dx[uVar3])) {
        dVar9 = 1.0 / ABS(dx[uVar3]);
      }
      array[uVar3] = p[uVar3] / dVar9;
      uVar3 = uVar3 + 1;
    } while (uVar6 != uVar3);
  }
  dVar8 = array_max_abs(array,N);
  dVar9 = (*funcpt->funcpt)(xi,N,funcpt->params);
  if (1.79769313486232e+308 <= ABS(dVar9)) {
    pcVar5 = "Program Exiting as the function value exceeds the maximum double value";
  }
  else {
    if (!NAN(dVar9)) {
      dVar8 = stol / dVar8;
      dVar10 = maxstep / dVar7;
      local_54 = 100;
      local_128 = 1.0;
      local_88 = 1.0;
      dVar15 = 1.0;
      do {
        if (0 < N) {
          uVar3 = 0;
          do {
            B_00[uVar3] = p[uVar3] * dVar15;
            uVar3 = uVar3 + 1;
          } while (uVar6 != uVar3);
        }
        madd(xi,B_00,x,1,N);
        dVar11 = (*funcpt->funcpt)(x,N,funcpt->params);
        if (1.79769313486232e+308 <= ABS(dVar11)) {
LAB_001251ac:
          pcVar5 = "Program Exiting as the function value exceeds the maximum double value";
LAB_001251bc:
          printf(pcVar5);
LAB_001251c3:
          iVar2 = 0xf;
          goto LAB_001251d0;
        }
        if (NAN(dVar11)) {
LAB_001251b5:
          pcVar5 = "Program Exiting as the function returns NaN";
          goto LAB_001251bc;
        }
        dVar12 = *C;
        dVar14 = dVar15;
        if (dVar11 <= dVar15 * 0.0001 * dVar12 + dVar9) {
          iVar2 = grad_fd(funcpt,funcgrad,x,N,dx,eps2,jacf);
          if (iVar2 == 0xf) {
            return 0xf;
          }
          mmult(jacf,p,C_00,1,N,1);
          local_54 = 0;
          if (*C_00 <= *C * 0.4 && *C * 0.4 != *C_00) {
            if ((((dVar7 < maxstep) && (dVar15 == 1.0)) && (!NAN(dVar15))) &&
               ((dVar11 <= dVar15 * 0.0001 * *C + dVar9 &&
                (dVar14 = *C * 0.4, dVar12 = dVar15, *C_00 <= dVar14 && dVar14 != *C_00)))) {
              while (dVar17 = dVar15, dVar14 = dVar11, dVar11 = dVar14, dVar15 = dVar17,
                    dVar12 < dVar10) {
                dVar12 = dVar17 + dVar17;
                dVar15 = dVar12;
                if (dVar10 <= dVar12) {
                  dVar15 = dVar10;
                }
                if (0 < N) {
                  uVar3 = 0;
                  do {
                    B_00[uVar3] = p[uVar3] * dVar15;
                    uVar3 = uVar3 + 1;
                  } while (uVar6 != uVar3);
                }
                madd(xi,B_00,x,1,N);
                dVar11 = (*funcpt->funcpt)(x,N,funcpt->params);
                if (1.79769313486232e+308 <= ABS(dVar11)) goto LAB_001251ac;
                if (NAN(dVar11)) goto LAB_001251b5;
                if (dVar11 <= dVar15 * 0.0001 * *C + dVar9) {
                  iVar2 = grad_fd(funcpt,funcgrad,x,N,dx,eps2,jacf);
                  if (iVar2 == 0xf) goto LAB_001251a1;
                  mmult(jacf,p,C_00,1,N,1);
                }
                local_128 = dVar17;
                local_88 = dVar14;
                if ((dVar15 * 0.0001 * *C + dVar9 < dVar11) ||
                   (dVar14 = *C * 0.4, dVar14 < *C_00 || dVar14 == *C_00)) break;
              }
            }
            if ((dVar15 < 1.0) ||
               ((dVar14 = dVar15, 1.0 < dVar15 && (dVar15 * 0.0001 * *C + dVar9 < dVar11)))) {
              dVar12 = dVar15;
              if (local_128 <= dVar15) {
                dVar12 = local_128;
              }
              dVar14 = *C_00;
              bVar1 = dVar14 < *C * 0.4;
              if ((dVar14 < *C * 0.4) && (dVar8 <= ABS(local_128 - dVar15))) {
                local_d8 = dVar11;
                if (local_128 <= dVar15) {
                  local_d8 = local_88;
                }
                dVar17 = ABS(local_128 - dVar15);
                dVar11 = (double)(~-(ulong)(dVar15 < local_128) & (ulong)dVar11 |
                                 -(ulong)(dVar15 < local_128) & (ulong)local_88);
                do {
                  dVar15 = dVar11 - (dVar14 * dVar17 + local_d8);
                  dVar15 = (-dVar14 * dVar17 * dVar17) / (dVar15 + dVar15);
                  dVar14 = dVar17 * 0.2;
                  if (dVar17 * 0.2 <= dVar15) {
                    dVar14 = dVar15;
                  }
                  dVar15 = dVar12 + dVar14;
                  if (0 < N) {
                    uVar3 = 0;
                    do {
                      B_00[uVar3] = p[uVar3] * dVar15;
                      uVar3 = uVar3 + 1;
                    } while (uVar6 != uVar3);
                  }
                  madd(xi,B_00,x,1,N);
                  dVar13 = (*funcpt->funcpt)(x,N,funcpt->params);
                  if (1.79769313486232e+308 <= ABS(dVar13)) goto LAB_001251ac;
                  if (NAN(dVar13)) goto LAB_001251b5;
                  dVar18 = dVar14;
                  dVar16 = dVar13;
                  if (dVar13 <= dVar15 * 0.0001 * *C + dVar9) {
                    iVar2 = grad_fd(funcpt,funcgrad,x,N,dx,eps2,jacf);
                    if (iVar2 == 0xf) goto LAB_001251c3;
                    mmult(jacf,p,C_00,1,N,1);
                    dVar18 = dVar17;
                    dVar16 = dVar11;
                    if (*C_00 <= *C * 0.4 && *C * 0.4 != *C_00) {
                      dVar12 = dVar15;
                      dVar18 = dVar17 - dVar14;
                      local_d8 = dVar13;
                    }
                  }
                  dVar14 = *C_00;
                  bVar1 = dVar14 < *C * 0.4;
                } while ((dVar14 < *C * 0.4) && (dVar17 = dVar18, dVar11 = dVar16, dVar8 <= dVar18))
                ;
              }
              dVar14 = dVar15;
              if (bVar1) {
                if (0 < N) {
                  uVar3 = 0;
                  do {
                    B_00[uVar3] = p[uVar3] * dVar12;
                    uVar3 = uVar3 + 1;
                  } while (uVar6 != uVar3);
                }
                madd(xi,B_00,x,1,N);
                local_54 = -5;
              }
            }
          }
        }
        else if (dVar15 < dVar8) {
          local_54 = 1;
          if (0 < N) {
            uVar3 = 0;
            do {
              x[uVar3] = xi[uVar3];
              uVar3 = uVar3 + 1;
            } while (uVar6 != uVar3);
          }
        }
        else {
          if ((dVar15 != 1.0) || (NAN(dVar15))) {
            *A = 1.0 / (dVar15 * dVar15);
            A[1] = -1.0 / (local_128 * local_128);
            A[2] = -local_128 / (dVar15 * dVar15);
            A[3] = dVar15 / (local_128 * local_128);
            *B = (dVar11 - dVar9) - dVar15 * dVar12;
            B[1] = (local_88 - dVar9) - local_128 * dVar12;
            mmult(A,B,C_01,2,2,1);
            scale(C_01,1,2,1.0 / (dVar15 - local_128));
            dVar12 = *C_01;
            if ((dVar12 != 0.0) || (NAN(dVar12))) {
              dVar14 = C_01[1];
              dVar12 = dVar14 * dVar14 + dVar12 * -3.0 * *C;
              if (dVar12 < 0.0) {
                dVar12 = sqrt(dVar12);
              }
              else {
                dVar12 = SQRT(dVar12);
              }
              dVar12 = dVar12 - dVar14;
              dVar14 = 3.0;
              pdVar4 = C_01;
            }
            else {
              dVar12 = -*C;
              dVar14 = 2.0;
              pdVar4 = C_01 + 1;
            }
            dVar12 = dVar12 / (dVar14 * *pdVar4);
            if (dVar15 * 0.5 < dVar12) {
              dVar12 = dVar15 * 0.5;
            }
          }
          else {
            dVar14 = (dVar11 - dVar9) - dVar12;
            dVar12 = -dVar12 / (dVar14 + dVar14);
          }
          uVar3 = -(ulong)(dVar12 <= dVar15 * 0.1);
          local_88 = dVar11;
          dVar14 = (double)(~uVar3 & (ulong)dVar12 | (ulong)(dVar15 * 0.1) & uVar3);
          local_128 = dVar15;
        }
        dVar15 = dVar14;
      } while (1 < local_54);
      iVar2 = 5;
      if (local_54 != -5) {
        iVar2 = local_54;
      }
      goto LAB_001251d0;
    }
    pcVar5 = "Program Exiting as the function returns NaN";
  }
  printf(pcVar5);
LAB_001251a1:
  iVar2 = 0xf;
LAB_001251d0:
  free(C);
  free(A);
  free(B);
  free(C_01);
  free(array);
  free(B_00);
  free(C_00);
  return iVar2;
}

Assistant:

int lnsrchmod(custom_function *funcpt, custom_gradient *funcgrad, double *xi, double *jac, double *p, int N, double * dx, double maxstep,
		double eps2,double stol,double *x,double *jacf) {
	int retval,i,gfdcode;
	double alpha,lambda,lambdamin,funcf,funci,lambdaprev,lambdatemp,funcprev;
	double lambda2,lambdaprev2,ll,den,rell,nlen;
	double *slopei,*temp1,*temp2,*ab,*rcheck,*pl;
	double *slopen;
	double beta,lambdamax,lambdalo,lambdainc,lambdadiff,funclo,funchi;
	
	slopei = (double*) malloc(sizeof(double) *1);
	slopen = (double*) malloc(sizeof(double) *1);
	temp1 = (double*) malloc(sizeof(double) *4);
	temp2 = (double*) malloc(sizeof(double) *2);
	ab = (double*) malloc(sizeof(double) *2);
	rcheck = (double*) malloc(sizeof(double) *N);
	pl = (double*) malloc(sizeof(double) *N);
	retval = 100;
	alpha = 1e-04;
	lambda = 1.0;
	nlen = 0.0;
	beta = 0.4;
	gfdcode = 0;
	funcprev = 1.0; // funcprev and lambdaprev are initialized to suppress warnings
	lambdaprev = 1.0; // These values are not used as the program sets the value later on.
	
	for(i = 0; i < N;++i) {
		nlen += dx[i] * p[i] * dx[i] * p[i];
	}
	nlen = sqrt(nlen);
	
	if (nlen > maxstep) {
		scale(p,1,N,maxstep/nlen);
		nlen = maxstep;
	}
	//mdisplay(p,1,N);
	mmult(jac,p,slopei,1,N,1);
	for(i = 0; i < N;++i) {
		if (fabs(xi[i]) > 1.0 /fabs(dx[i])) {
			den = fabs(xi[i]);
		} else {
			den = 1.0 /fabs(dx[i]);
		}
		rcheck[i] = p[i]/den;
	}
	
	rell = array_max_abs(rcheck,N);
	
	lambdamin = stol/rell;
	
	funci = FUNCPT_EVAL(funcpt, xi, N);
	
	if (funci >= DBL_MAX || funci <= -DBL_MAX) {
		printf("Program Exiting as the function value exceeds the maximum double value");
		free(slopei);
		free(temp1);
		free(temp2);
		free(ab);
		free(rcheck);
		free(pl);
		free(slopen);
		return 15;
	}
	if (funci != funci) {
		printf("Program Exiting as the function returns NaN");
		free(slopei);
		free(temp1);
		free(temp2);
		free(ab);
		free(rcheck);
		free(pl);
		free(slopen);
		return 15;
	}
	while (retval > 1) {
		for(i = 0; i < N;++i) {
			pl[i] = p[i] * lambda;
		}
		madd(xi,pl,x,1,N);
		funcf = FUNCPT_EVAL(funcpt, x, N);
		//printf("%g lmax %g %g \n",lambda,funcf,funci + alpha *lambda *slopei[0]);
		if (funcf >= DBL_MAX || funcf <= -DBL_MAX) {
			printf("Program Exiting as the function value exceeds the maximum double value");
			free(slopei);
			free(temp1);
			free(temp2);
			free(ab);
			free(rcheck);
			free(pl);
			free(slopen);
			return 15;
		}
		if (funcf != funcf) {
			printf("Program Exiting as the function returns NaN");
			free(slopei);
			free(temp1);
			free(temp2);
			free(ab);
			free(rcheck);
			free(pl);
			free(slopen);
			return 15;
		}
		if (funcf <= funci + alpha *lambda *slopei[0]) {
			gfdcode = grad_fd(funcpt,funcgrad,x,N,dx,eps2,jacf);
			if (gfdcode == 15) {
				return 15;
			}
			mmult(jacf,p,slopen,1,N,1);
			
			if(slopen[0] < beta * slopei[0]) {
					if (lambda == 1.0 && nlen < maxstep) {
						lambdamax = maxstep / nlen;
						
						while (funcf <= funci + alpha *lambda *slopei[0] && slopen[0] < beta * slopei[0] && lambda < lambdamax) {
							lambdaprev = lambda;
							funcprev = funcf;
							if ( 2*lambda < lambdamax) {
								lambda = 2*lambda;
							} else {
								lambda = lambdamax;
							}
							for(i = 0; i < N;++i) {
								pl[i] = p[i] * lambda;
							}
							madd(xi,pl,x,1,N);
							funcf = FUNCPT_EVAL(funcpt, x, N);
							if (funcf >= DBL_MAX || funcf <= -DBL_MAX) {
								printf("Program Exiting as the function value exceeds the maximum double value");
								free(slopei);
								free(temp1);
								free(temp2);
								free(ab);
								free(rcheck);
								free(pl);
								free(slopen);
								return 15;
							}
							if (funcf != funcf) {
								printf("Program Exiting as the function returns NaN");
								free(slopei);
								free(temp1);
								free(temp2);
								free(ab);
								free(rcheck);
								free(pl);
								free(slopen);
								return 15;
							}
							if (funcf <= funci + alpha *lambda *slopei[0]) {
								gfdcode = grad_fd(funcpt,funcgrad,x,N,dx,eps2,jacf);
								if (gfdcode == 15) {
									free(slopei);
									free(temp1);
									free(temp2);
									free(ab);
									free(rcheck);
									free(pl);
									free(slopen);
									return 15;
								}
								mmult(jacf,p,slopen,1,N,1);
							}
						}
						
					}
					if (lambda < 1.0 || (lambda > 1.0 && funcf > funci + alpha *lambda *slopei[0])) {
						
						if (lambda < lambdaprev) {
							lambdalo = lambda; 
						} else {
							lambdalo = lambdaprev; 
						}
						lambdadiff = fabs(lambdaprev - lambda);
						
						if (lambda < lambdaprev) {
							funclo = funcf;
							funchi = funcprev;
						} else {
							funchi = funcf;
							funclo = funcprev;
						}

						while ((slopen[0] < beta * slopei[0]) && lambdadiff >= lambdamin) {
							lambdainc = -slopen[0] * lambdadiff * lambdadiff / (2.0 * (funchi - (funclo + slopen[0] *lambdadiff)));
							if ( lambdainc < 0.2 * lambdadiff) {
								lambdainc = 0.2 * lambdadiff;
							}
							lambda = lambdalo + lambdainc;
							for(i = 0; i < N;++i) {
								pl[i] = p[i] * lambda;
							}
							madd(xi,pl,x,1,N);
							funcf = FUNCPT_EVAL(funcpt, x, N);
							if (funcf >= DBL_MAX || funcf <= -DBL_MAX) {
								printf("Program Exiting as the function value exceeds the maximum double value");
								free(slopei);
								free(temp1);
								free(temp2);
								free(ab);
								free(rcheck);
								free(pl);
								free(slopen);
								return 15;
							}
							if (funcf != funcf) {
								printf("Program Exiting as the function returns NaN");
								free(slopei);
								free(temp1);
								free(temp2);
								free(ab);
								free(rcheck);
								free(pl);
								free(slopen);
								return 15;
							}
							if (funcf > funci + alpha *lambda *slopei[0]) {
								lambdadiff = lambdainc;
								funchi = funcf;
							} else {
								gfdcode = grad_fd(funcpt,funcgrad,x,N,dx,eps2,jacf);
								if (gfdcode == 15) {
									free(slopei);
									free(temp1);
									free(temp2);
									free(ab);
									free(rcheck);
									free(pl);
									free(slopen);
									return 15;
								}
								mmult(jacf,p,slopen,1,N,1);
								if (slopen[0] < beta * slopei[0]) {
									lambdalo = lambda;
									lambdadiff -= lambdainc;
									funclo = funcf;
								}
							}
						}
						if (slopen[0] < beta * slopei[0]) {
							retval = -5;
							funcf = funclo;
							for(i = 0; i < N;++i) {
								pl[i] = p[i] * lambdalo;
							}
							madd(xi,pl,x,1,N);
						}
					}
						
			}
			
			if (retval != -5) {
				retval = 0;
			}
		} else if (lambda < lambdamin) {
			retval = 1;
			for (i = 0; i < N;++i) {
				x[i] = xi[i]; // Check
			}
		} else {
			if (lambda == 1.0) {
				lambdatemp = - slopei[0] / (2.0 * (funcf - funci - slopei[0])); 
			} else {
				lambda2 = lambda * lambda;
				lambdaprev2 = lambdaprev * lambdaprev;
				ll = lambda - lambdaprev;
				temp1[0] = 1.0 / lambda2; temp1[1] = -1.0 /lambdaprev2;
				temp1[2] = - lambdaprev / lambda2; temp1[3] = lambda /lambdaprev2;
				temp2[0] = funcf - funci - lambda * slopei[0];
				temp2[1] = funcprev - funci - lambdaprev * slopei[0];
				mmult(temp1,temp2,ab,2,2,1);
				scale(ab,1,2,1.0/ll);
				if (ab[0] == 0.0) {
					lambdatemp = - slopei[0] / (2.0 * ab[1]);
				} else {
					lambdatemp = (-ab[1] + sqrt( ab[1] * ab[1] - 3.0 * ab[0] *slopei[0]))/ (3.0 * ab[0]);
				}
				
				if (lambdatemp > 0.5 * lambda) {
					lambdatemp = 0.5 * lambda;
				}
			}
			lambdaprev = lambda;
			funcprev = funcf;
			if (lambdatemp <= 0.1 * lambda) {
				lambda = 0.1 * lambda;
			} else {
				lambda = lambdatemp;
			}
		}
	
	}
	
	if (retval == -5) {
		retval = 5;
	}
	
	free(slopei);
	free(temp1);
	free(temp2);
	free(ab);
	free(rcheck);
	free(pl);
	free(slopen);
	return retval;
}